

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceDecomposition.cpp
# Opt level: O2

void __thiscall
OpenMD::ForceDecomposition::fillSelfData(ForceDecomposition *this,SelfData *sdat,int atom)

{
  uint uVar1;
  
  sdat->atid = (this->idents).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[atom];
  Vector<double,_7U>::operator=(&sdat->selfPot,&this->selfPot);
  Vector<double,_7U>::operator=(&sdat->selePot,&this->selectedSelfPot);
  uVar1 = this->atomStorageLayout_;
  if ((uVar1 >> 0xd & 1) != 0) {
    sdat->skippedCharge =
         (this->snap_->atomData).skippedCharge.super__Vector_base<double,_std::allocator<double>_>.
         _M_impl.super__Vector_impl_data._M_start[atom];
  }
  if ((uVar1 & 0x40) != 0) {
    sdat->particlePot =
         (this->snap_->atomData).particlePot.super__Vector_base<double,_std::allocator<double>_>.
         _M_impl.super__Vector_impl_data._M_start[atom];
  }
  if ((uVar1 >> 0xe & 1) != 0) {
    sdat->flucQ = (this->snap_->atomData).flucQPos.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[atom];
  }
  if ((uVar1 >> 0x10 & 1) != 0) {
    sdat->flucQfrc =
         (this->snap_->atomData).flucQFrc.super__Vector_base<double,_std::allocator<double>_>.
         _M_impl.super__Vector_impl_data._M_start[atom];
  }
  return;
}

Assistant:

void ForceDecomposition::fillSelfData(SelfData& sdat, int atom) {
    sdat.atid    = idents[atom];
    sdat.selfPot = selfPot;
    sdat.selePot = selectedSelfPot;

    if (atomStorageLayout_ & DataStorage::dslSkippedCharge) {
      sdat.skippedCharge = snap_->atomData.skippedCharge[atom];
    }

    if (atomStorageLayout_ & DataStorage::dslParticlePot) {
      sdat.particlePot = snap_->atomData.particlePot[atom];
    }

    if (atomStorageLayout_ & DataStorage::dslFlucQPosition) {
      sdat.flucQ = snap_->atomData.flucQPos[atom];
    }

    if (atomStorageLayout_ & DataStorage::dslFlucQForce) {
      sdat.flucQfrc = snap_->atomData.flucQFrc[atom];
    }
  }